

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawSprite
          (PixelGameEngine *this,int32_t x,int32_t y,Sprite *sprite,uint32_t scale,uint8_t flip)

{
  Pixel PVar1;
  int iVar2;
  int iVar3;
  int32_t i;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int32_t j;
  int iVar7;
  bool bVar8;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  
  if (sprite != (Sprite *)0x0) {
    local_6c = 0;
    local_68 = 1;
    local_74 = 0;
    local_70 = local_68;
    if ((flip & 1) != 0) {
      local_70 = -1;
      local_74 = sprite->width + -1;
    }
    if ((flip & 2) != 0) {
      local_6c = sprite->height + -1;
      local_68 = -1;
    }
    if (scale < 2) {
      for (iVar3 = 0; iVar3 < sprite->width; iVar3 = iVar3 + 1) {
        iVar7 = local_6c;
        for (iVar2 = 0; iVar2 < sprite->height; iVar2 = iVar2 + 1) {
          PVar1 = Sprite::GetPixel(sprite,local_74,iVar7);
          (*this->_vptr_PixelGameEngine[5])
                    (this,x + iVar3,(ulong)(uint)(y + iVar2),(ulong)(uint)PVar1.field_0);
          iVar7 = iVar7 + local_68;
        }
        local_74 = local_74 + local_70;
      }
    }
    else {
      for (iVar3 = 0; iVar3 < sprite->width; iVar3 = iVar3 + 1) {
        iVar7 = local_6c;
        local_64 = y;
        for (iVar2 = 0; iVar2 < sprite->height; iVar2 = iVar2 + 1) {
          for (uVar5 = 0; uVar5 != scale; uVar5 = uVar5 + 1) {
            uVar6 = local_64;
            uVar4 = scale;
            while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
              PVar1 = Sprite::GetPixel(sprite,local_74,iVar7);
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(iVar3 * scale + x + uVar5),(ulong)uVar6,
                         (ulong)(uint)PVar1.field_0);
              uVar6 = uVar6 + 1;
            }
          }
          iVar7 = iVar7 + local_68;
          local_64 = local_64 + scale;
        }
        local_74 = local_74 + local_70;
      }
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawSprite(int32_t x, int32_t y, Sprite *sprite, uint32_t scale, uint8_t flip)
	{
		if (sprite == nullptr)
			return;

		int32_t fxs = 0, fxm = 1, fx = 0;
		int32_t fys = 0, fym = 1, fy = 0;
		if (flip & olc::Sprite::Flip::HORIZ)
		{
			fxs = sprite->width - 1;
			fxm = -1;
		}
		if (flip & olc::Sprite::Flip::VERT)
		{
			fys = sprite->height - 1;
			fym = -1;
		}

		if (scale > 1)
		{
			fx = fxs;
			for (int32_t i = 0; i < sprite->width; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < sprite->height; j++, fy += fym)
					for (uint32_t is = 0; is < scale; is++)
						for (uint32_t js = 0; js < scale; js++)
							Draw(x + (i * scale) + is, y + (j * scale) + js, sprite->GetPixel(fx, fy));
			}
		}
		else
		{
			fx = fxs;
			for (int32_t i = 0; i < sprite->width; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < sprite->height; j++, fy += fym)
					Draw(x + i, y + j, sprite->GetPixel(fx, fy));
			}
		}
	}